

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isVDSetTerminator(iso9660 *iso9660,uchar *h)

{
  int iVar1;
  uchar *h_local;
  iso9660 *iso9660_local;
  
  if (*h == 0xff) {
    if (h[6] == '\x01') {
      iVar1 = isNull(iso9660,h,7,0x7f9);
      if (iVar1 == 0) {
        iso9660_local._4_4_ = 0;
      }
      else {
        iso9660_local._4_4_ = 1;
      }
    }
    else {
      iso9660_local._4_4_ = 0;
    }
  }
  else {
    iso9660_local._4_4_ = 0;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
isVDSetTerminator(struct iso9660 *iso9660, const unsigned char *h)
{
	(void)iso9660; /* UNUSED */

	/* Type of the Volume Descriptor Set Terminator must be 255. */
	if (h[0] != 255)
		return (0);

	/* Volume Descriptor Version must be 1. */
	if (h[6] != 1)
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, 7, 2048-7))
		return (0);

	return (1);
}